

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

string * ApprovalTests::StringUtils::leftTrim(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  pointer pcVar5;
  undefined8 uVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  
  pbVar3 = (byte *)(s->_M_dataplus)._M_p;
  uVar4 = s->_M_string_length;
  pbVar2 = pbVar3 + uVar4;
  pbVar8 = pbVar3;
  if (0 < (long)uVar4 >> 2) {
    pbVar8 = pbVar3 + (uVar4 & 0xfffffffffffffffc);
    lVar9 = ((long)uVar4 >> 2) + 1;
    pbVar10 = pbVar3 + 3;
    do {
      iVar7 = isspace((uint)pbVar10[-3]);
      if (iVar7 == 0) {
        pbVar10 = pbVar10 + -3;
        goto LAB_00191315;
      }
      iVar7 = isspace((uint)pbVar10[-2]);
      if (iVar7 == 0) {
        pbVar10 = pbVar10 + -2;
        goto LAB_00191315;
      }
      iVar7 = isspace((uint)pbVar10[-1]);
      if (iVar7 == 0) {
        pbVar10 = pbVar10 + -1;
        goto LAB_00191315;
      }
      iVar7 = isspace((uint)*pbVar10);
      if (iVar7 == 0) goto LAB_00191315;
      lVar9 = lVar9 + -1;
      pbVar10 = pbVar10 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)pbVar2 - (long)pbVar8;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      pbVar10 = pbVar2;
      if ((lVar9 != 3) || (iVar7 = isspace((uint)*pbVar8), pbVar10 = pbVar8, iVar7 == 0))
      goto LAB_00191315;
      pbVar8 = pbVar8 + 1;
    }
    iVar7 = isspace((uint)*pbVar8);
    pbVar10 = pbVar8;
    if (iVar7 == 0) goto LAB_00191315;
    pbVar8 = pbVar8 + 1;
  }
  iVar7 = isspace((uint)*pbVar8);
  pbVar10 = pbVar8;
  if (iVar7 != 0) {
    pbVar10 = pbVar2;
  }
LAB_00191315:
  if (pbVar2 == pbVar10) {
    s->_M_string_length = 0;
    *pbVar3 = 0;
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)s,0);
  }
  pcVar5 = (s->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::leftTrim(std::string s)
    {

        s.erase(s.begin(), std::find_if(s.begin(), s.end(), [](unsigned char ch) {
                    return !std::isspace(ch);
                }));
        return s;
    }